

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::execute_cfunction(Forth *this)

{
  iterator iVar1;
  Xt num;
  Xt local_c;
  
  local_c = this->executingWord;
  iVar1 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_void_(*)(cppforth::Forth_*)>,_std::_Select1st<std::pair<const_unsigned_int,_void_(*)(cppforth::Forth_*)>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_void_(*)(cppforth::Forth_*)>_>_>
          ::find(&(this->cfunctions)._M_t,&local_c);
  if (((_Rb_tree_header *)iVar1._M_node != &(this->cfunctions)._M_t._M_impl.super__Rb_tree_header)
     && (iVar1._M_node[1]._M_parent != (_Base_ptr)0x0)) {
    (*(code *)iVar1._M_node[1]._M_parent)(this);
  }
  return;
}

Assistant:

void execute_cfunction(){
			auto num = executingWord;
			auto finded = cfunctions.find(num) ;
			if (finded != cfunctions.end()){
				auto function = finded->second;
				if(function)
					function(this);
			}
		}